

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.c
# Opt level: O3

wchar_t assertion_file_contents(char *filename,wchar_t line,void *buff,wchar_t s,char *fn)

{
  int iVar1;
  FILE *__stream;
  char *__ptr;
  size_t sVar2;
  size_t l;
  wchar_t wVar3;
  char *ref;
  char *p;
  
  assertions = assertions + L'\x01';
  msg = nextmsg;
  nextmsg = (char *)0x0;
  __stream = fopen(fn,"rb");
  if (__stream == (FILE *)0x0) {
    wVar3 = L'\0';
    failure_start(filename,line,"File should exist: %s",fn);
    failure_finish((void *)0x0);
  }
  else {
    __ptr = (char *)malloc((long)(s * 2));
    sVar2 = fread(__ptr,1,(long)(s * 2),__stream);
    fclose(__stream);
    wVar3 = (wchar_t)sVar2;
    if ((wVar3 == s) && (iVar1 = bcmp(buff,__ptr,(long)s), iVar1 == 0)) {
      free(__ptr);
      wVar3 = L'\x01';
    }
    else {
      failure_start(filename,line,"File contents don\'t match");
      logprintf("  file=\"%s\"\n");
      if (wVar3 < L'\x01') {
        logprintf("  File empty, contents should be:\n");
        wVar3 = L'Ȁ';
        if (s < L'Ȁ') {
          wVar3 = s;
        }
        l = (size_t)wVar3;
        ref = (char *)0x0;
        p = (char *)buff;
      }
      else {
        l = 0x200;
        ref = (char *)buff;
        p = __ptr;
        if ((uint)wVar3 < 0x200) {
          l = sVar2 & 0xffffffff;
        }
      }
      hexdump(p,ref,l,0);
      wVar3 = L'\0';
      failure_finish((void *)0x0);
      free(__ptr);
    }
  }
  return wVar3;
}

Assistant:

int
assertion_file_contents(const char *filename, int line, const void *buff, int s, const char *fn)
{
	char *contents;
	FILE *f;
	int n;

	assertion_count(filename, line);

	f = fopen(fn, "rb");
	if (f == NULL) {
		failure_start(filename, line,
		    "File should exist: %s", fn);
		failure_finish(NULL);
		return (0);
	}
	contents = malloc(s * 2);
	n = (int)fread(contents, 1, s * 2, f);
	fclose(f);
	if (n == s && memcmp(buff, contents, s) == 0) {
		free(contents);
		return (1);
	}
	failure_start(filename, line, "File contents don't match");
	logprintf("  file=\"%s\"\n", fn);
	if (n > 0)
		hexdump(contents, buff, n > 512 ? 512 : n, 0);
	else {
		logprintf("  File empty, contents should be:\n");
		hexdump(buff, NULL, s > 512 ? 512 : s, 0);
	}
	failure_finish(NULL);
	free(contents);
	return (0);
}